

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

uint32_t window1(void *blob,int len,int start,int count)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int i;
  uint32_t t;
  int nbits;
  uint32_t in_stack_ffffffffffffffd8;
  int len_00;
  int iVar1;
  uint32_t uVar2;
  
  uVar2 = 0;
  len_00 = 0;
  while (len_00 < in_ECX) {
    iVar1 = len_00;
    getbit_wrap(in_RDI,in_ESI,in_EDX % (in_ESI << 3) + len_00);
    setbit((void *)CONCAT44(uVar2,iVar1),len_00,in_stack_ffffffffffffffd8,0);
    len_00 = iVar1 + 1;
  }
  return uVar2;
}

Assistant:

uint32_t window1 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  uint32_t t = 0;

  for(int i = 0; i < count; i++)
  {
    setbit(&t,sizeof(t),i, getbit_wrap(blob,len,start+i));
  }

  return t;
}